

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<ExternModuleInfo,_false,_false>::grow_and_add
          (FastVector<ExternModuleInfo,_false,_false> *this,uint newSize,ExternModuleInfo *val)

{
  uint *puVar1;
  uint uVar2;
  ExternModuleInfo *pEVar3;
  ExternModuleInfo *pEVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  pEVar3 = this->data;
  grow_no_destroy(this,newSize);
  pEVar4 = this->data;
  uVar2 = this->count;
  this->count = uVar2 + 1;
  uVar5 = val->nameHash;
  uVar6 = val->nameOffset;
  uVar7 = val->funcStart;
  uVar8 = val->funcCount;
  uVar9 = val->variableOffset;
  uVar10 = val->sourceOffset;
  uVar11 = val->sourceSize;
  puVar1 = &pEVar4[uVar2].funcCount;
  *puVar1 = val->funcCount;
  puVar1[1] = uVar9;
  puVar1[2] = uVar10;
  puVar1[3] = uVar11;
  pEVar4 = pEVar4 + uVar2;
  pEVar4->nameHash = uVar5;
  pEVar4->nameOffset = uVar6;
  pEVar4->funcStart = uVar7;
  pEVar4->funcCount = uVar8;
  if (pEVar3 != (ExternModuleInfo *)0x0) {
    (*(code *)NULLC::dealloc)(pEVar3);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}